

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O2

int cycle_phi_p(bb_insn_t_conflict bb_insn)

{
  uint uVar1;
  ulong uVar2;
  MIR_insn_t pMVar3;
  ulong uVar4;
  
  uVar1 = 0;
  uVar2 = *(ulong *)&bb_insn->insn->field_0x18;
  if ((int)uVar2 == 0xba) {
    uVar2 = uVar2 >> 0x20;
    pMVar3 = bb_insn->insn + 1;
    uVar4 = 1;
    while ((uVar4 < uVar2 &&
           ((pMVar3->data == (void *)0x0 ||
            (*(bb_t_conflict *)(*(long *)((long)pMVar3->data + 8) + 0x30) != bb_insn->bb))))) {
      uVar4 = uVar4 + 1;
      pMVar3 = (MIR_insn_t)&pMVar3->ops[0].u;
    }
    uVar1 = (uint)(uVar4 < uVar2);
  }
  return uVar1;
}

Assistant:

static int cycle_phi_p (bb_insn_t bb_insn) { /* we are not in pure SSA at this stage */
  ssa_edge_t se;
  if (bb_insn->insn->code != MIR_PHI) return FALSE;
  for (size_t i = 1; i < bb_insn->insn->nops; i++)
    if ((se = bb_insn->insn->ops[i].data) != NULL && se->def->bb == bb_insn->bb) return TRUE;
  return FALSE;
}